

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  uint uVar2;
  SrcList *pSVar3;
  SrcList_item *pSVar4;
  long lVar5;
  int *piVar6;
  u64 n;
  SrcList_item *pSVar7;
  SrcList *pSVar8;
  SrcList_item *pSVar9;
  SrcList_item *pSVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  
  bVar13 = 0;
  pSVar8 = pSrc;
  if (pSrc->nAlloc < (uint)(pSrc->nSrc + nExtra)) {
    n = (long)(nExtra + pSrc->nSrc * 2 + -1) * 0x70 + 0x78;
    if (((pSrc < (SrcList *)(db->lookaside).pStart) || ((SrcList *)(db->lookaside).pEnd <= pSrc)) ||
       (pSVar3 = pSrc, (db->lookaside).sz < n)) {
      pSVar3 = (SrcList *)dbReallocFinish(db,pSrc,n);
    }
    if (pSVar3 != (SrcList *)0x0) {
      if (((db == (sqlite3 *)0x0) || (pSVar3 < (SrcList *)(db->lookaside).pStart)) ||
         ((SrcList *)(db->lookaside).pEnd <= pSVar3)) {
        uVar2 = (*sqlite3Config.m.xSize)(pSVar3);
      }
      else {
        uVar2 = (uint)(db->lookaside).sz;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)uVar2 - 0x78U >> 4;
      pSVar3->nAlloc = SUB164(auVar1 * ZEXT816(0x2492492492492493),8) + 1;
      pSVar8 = pSVar3;
    }
    if (pSVar3 == (SrcList *)0x0) {
      return pSrc;
    }
  }
  lVar11 = (long)pSVar8->nSrc;
  lVar12 = (long)iStart;
  if (iStart < pSVar8->nSrc) {
    pSVar4 = pSVar8->a + lVar11 + -1;
    pSVar7 = pSVar8->a + nExtra + lVar11 + -1;
    do {
      lVar11 = lVar11 + -1;
      pSVar9 = pSVar4;
      pSVar10 = pSVar7;
      for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
        pSVar10->pSchema = pSVar9->pSchema;
        pSVar9 = (SrcList_item *)((long)pSVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        pSVar10 = (SrcList_item *)((long)pSVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      pSVar4 = pSVar4 + -1;
      pSVar7 = pSVar7 + -1;
    } while (iStart < lVar11);
  }
  pSVar8->nSrc = pSVar8->nSrc + nExtra;
  memset(pSVar8->a + lVar12,0,(ulong)(uint)nExtra * 0x70);
  if (0 < nExtra) {
    piVar6 = &pSVar8->a[lVar12].iCursor;
    do {
      *piVar6 = -1;
      lVar12 = lVar12 + 1;
      piVar6 = piVar6 + 0x1c;
    } while (lVar12 < iStart + nExtra);
  }
  return pSVar8;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc*2+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}